

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O3

PAL_ERROR CorUnix::InternalReleaseMutex(CPalThread *pthr,HANDLE hMutex)

{
  uint uVar1;
  long *local_38;
  IPalObject *pobjMutex;
  ISynchStateController *pssc;
  
  local_38 = (long *)0x0;
  pobjMutex = (IPalObject *)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalReleaseMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0x15c);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_00340703;
  uVar1 = (**(code **)(*g_pObjectManager + 0x28))
                    (g_pObjectManager,pthr,hMutex,&aotMutex,0,&local_38);
  if (uVar1 == 0) {
    uVar1 = (**(code **)(*local_38 + 0x28))(local_38,pthr,&pobjMutex);
    if (uVar1 == 0) {
      uVar1 = (*pobjMutex->_vptr_IPalObject[5])();
      if (uVar1 != 0) goto LAB_0034064c;
      uVar1 = 0;
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalReleaseMutex",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
              ,0x178);
      fprintf(_stderr,"Error %d obtaining synch state controller\n",(ulong)uVar1);
    }
  }
  else {
LAB_0034064c:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00340703;
  }
  if (pobjMutex != (IPalObject *)0x0) {
    (*pobjMutex->_vptr_IPalObject[6])();
  }
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 0x40))(local_38,pthr);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return uVar1;
  }
LAB_00340703:
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalReleaseMutex(
    CPalThread *pthr,
    HANDLE hMutex
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjMutex = NULL;
    ISynchStateController *pssc = NULL;

    _ASSERTE(NULL != pthr);

    ENTRY("InternalReleaseMutex(pthr=%p, hMutex=%p)\n",
        pthr,
        hMutex
        );

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pthr,
        hMutex,
        &aotMutex,
        0, // should be MUTEX_MODIFY_STATE -- current ignored (no Win32 security)
        &pobjMutex
        );

    if (NO_ERROR != palError)
    {
        ERROR("Unable to obtain object for handle %p (error %d)!\n", hMutex, palError);
        goto InternalReleaseMutexExit;
    }

    palError = pobjMutex->GetSynchStateController(
        pthr,
        &pssc
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d obtaining synch state controller\n", palError);
        goto InternalReleaseMutexExit;
    }

    palError = pssc->DecrementOwnershipCount();

    if (NO_ERROR != palError)
    {
        ERROR("Error %d decrementing mutex ownership count\n", palError);
        goto InternalReleaseMutexExit;
    }

InternalReleaseMutexExit:

    if (NULL != pssc)
    {
        pssc->ReleaseController();
    }

    if (NULL != pobjMutex)
    {
        pobjMutex->ReleaseReference(pthr);
    }

    LOGEXIT("InternalReleaseMutex returns %i\n", palError);

    return palError;
}